

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Logger::unregister_client(Logger *this,LoggerClient *c)

{
  SmartPointer<GEO::LoggerClient> local_20;
  LoggerClient *local_18;
  LoggerClient *c_local;
  Logger *this_local;
  
  local_18 = c;
  c_local = (LoggerClient *)this;
  SmartPointer<GEO::LoggerClient>::SmartPointer(&local_20,c);
  std::
  set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::erase(&this->clients_,&local_20);
  SmartPointer<GEO::LoggerClient>::~SmartPointer(&local_20);
  return;
}

Assistant:

void Logger::unregister_client(LoggerClient* c) {
        geo_debug_assert(clients_.find(c) != clients_.end());
	clients_.erase(c);
    }